

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

pointer __thiscall
slang::SmallVectorBase<slang::ast::StructuredAssignmentPatternExpression::TypeSetter>::
emplaceRealloc<slang::ast::StructuredAssignmentPatternExpression::TypeSetter>
          (SmallVectorBase<slang::ast::StructuredAssignmentPatternExpression::TypeSetter> *this,
          pointer pos,TypeSetter *args)

{
  ulong uVar1;
  undefined8 *puVar2;
  Expression *pEVar3;
  pointer pTVar4;
  pointer pTVar5;
  size_type sVar6;
  pointer pTVar7;
  long lVar8;
  ulong capacity;
  
  if (this->len == 0x7fffffffffffffff) {
    detail::throwLengthError();
  }
  capacity = this->len + 1;
  uVar1 = this->cap;
  if (capacity < uVar1 * 2) {
    capacity = uVar1 * 2;
  }
  if (0x7fffffffffffffff - uVar1 < uVar1) {
    capacity = 0x7fffffffffffffff;
  }
  lVar8 = (long)pos - (long)this->data_;
  pTVar4 = (pointer)detail::allocArray(capacity,0x10);
  pEVar3 = (args->expr).ptr;
  *(undefined8 *)((long)pTVar4 + lVar8) = (args->type).ptr;
  ((undefined8 *)((long)pTVar4 + lVar8))[1] = pEVar3;
  pTVar5 = this->data_;
  sVar6 = this->len;
  if (pTVar5 + sVar6 == pos) {
    pTVar7 = pTVar4;
    if (sVar6 != 0) {
      do {
        pEVar3 = (pTVar5->expr).ptr;
        (pTVar7->type).ptr = (pTVar5->type).ptr;
        (pTVar7->expr).ptr = pEVar3;
        pTVar5 = pTVar5 + 1;
        pTVar7 = pTVar7 + 1;
      } while (pTVar5 != pos);
    }
  }
  else {
    pTVar7 = pTVar4;
    if (pTVar5 != pos) {
      do {
        pEVar3 = (pTVar5->expr).ptr;
        (pTVar7->type).ptr = (pTVar5->type).ptr;
        (pTVar7->expr).ptr = pEVar3;
        pTVar5 = pTVar5 + 1;
        pTVar7 = pTVar7 + 1;
      } while (pTVar5 != pos);
      pTVar5 = this->data_;
      sVar6 = this->len;
    }
    if (pTVar5 + sVar6 != pos) {
      puVar2 = (undefined8 *)((long)pTVar4 + lVar8);
      do {
        pEVar3 = (pos->expr).ptr;
        puVar2[2] = (pos->type).ptr;
        puVar2[3] = pEVar3;
        pos = pos + 1;
        puVar2 = puVar2 + 2;
      } while (pos != pTVar5 + sVar6);
    }
  }
  if (this->data_ != (pointer)this->firstElement) {
    free(this->data_);
  }
  this->len = this->len + 1;
  this->cap = capacity;
  this->data_ = pTVar4;
  return (pointer)((long)pTVar4 + lVar8);
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)detail::allocArray(newCap, sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}